

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O1

void snga_dest_indices(Integer ndims,Integer *los,Integer *blos,Integer *dimss,Integer ndimd,
                      Integer *lod,Integer *blod,Integer *dimsd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (ndims < 1) {
    lVar2 = 0;
  }
  else {
    lVar1 = 1;
    lVar3 = 0;
    lVar2 = 0;
    do {
      lVar2 = lVar2 + (los[lVar3] - blos[lVar3]) * lVar1;
      lVar1 = lVar1 * dimss[lVar3];
      lVar3 = lVar3 + 1;
    } while (ndims != lVar3);
  }
  if (0 < ndims) {
    lVar1 = 0;
    do {
      *(long *)(ndimd + lVar1 * 8) = lVar2 % blod[lVar1] + lod[lVar1];
      lVar2 = lVar2 / blod[lVar1];
      lVar1 = lVar1 + 1;
    } while (ndims != lVar1);
  }
  return;
}

Assistant:

static void snga_dest_indices(Integer ndims, Integer *los, Integer *blos, Integer *dimss,
               Integer ndimd, Integer *lod, Integer *blod, Integer *dimsd)
{
    Integer idx = 0, i, factor=1;
        
    for(i=0;i<ndims;i++) {
        idx += (los[i] - blos[i])*factor;
        factor *= dimss[i];
    }
        
    for(i=0;i<ndims;i++) {
        lod[i] = idx % dimsd[i] + blod[i];
        idx /= dimsd[i];
    }
}